

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O3

InstructionAtom * __thiscall Instruction::get_imm_src(Instruction *this)

{
  ulong uVar1;
  InstructionAtom *pIVar2;
  
  uVar1 = (ulong)this->n_src;
  if (uVar1 != 0) {
    pIVar2 = this->src;
    do {
      if (pIVar2->kind == IMM) {
        return pIVar2;
      }
      pIVar2 = pIVar2 + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Instruction.cpp"
                ,0xf1,"InstructionAtom &Instruction::get_imm_src()");
}

Assistant:

InstructionAtom& Instruction::get_imm_src() {
  for (int i = 0; i < n_src; i++) {
    if (src[i].kind == InstructionAtom::IMM) {
      return src[i];
    }
  }
  assert(false);
  return src[0];
}